

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blob_detection.cpp
# Opt level: O0

void __thiscall Blob_Detection::BlobInfo::_getHeight(BlobInfo *this)

{
  bool bVar1;
  reference puVar2;
  iterator __last;
  long in_RDI;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  uint uVar3;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  in_stack_ffffffffffffffd0;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  in_stack_ffffffffffffffd8;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_10 [2];
  
  bVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     in_stack_ffffffffffffffd0._M_current);
  if ((!bVar1) && ((*(byte *)(in_RDI + 0xe4) & 1) == 0)) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    local_10[0] = std::
                  max_element<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                            (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
    puVar2 = __gnu_cxx::
             __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(local_10);
    uVar3 = *puVar2;
    __last = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                        CONCAT44(uVar3,in_stack_ffffffffffffffb8));
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               CONCAT44(uVar3,in_stack_ffffffffffffffb8));
    std::
    min_element<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              (in_stack_ffffffffffffffd8,
               (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                )__last._M_current);
    puVar2 = __gnu_cxx::
             __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                          *)&stack0xffffffffffffffd8);
    *(uint *)(in_RDI + 0xe0) = (uVar3 - *puVar2) + 1;
    *(undefined1 *)(in_RDI + 0xe4) = 1;
  }
  return;
}

Assistant:

void BlobInfo::_getHeight()
    {
        if( !_contourY.empty() && !_height.found ) {
            _height.value = *(std::max_element( _contourY.begin(), _contourY.end() )) -
                *(std::min_element( _contourY.begin(), _contourY.end() )) + 1;

            _height.found = true;
        }
    }